

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

JSON * phosg::JSON::parse(JSON *__return_storage_ptr__,char *s,size_t size,bool disable_extensions)

{
  bool bVar1;
  parse_error *this;
  allocator<char> local_71;
  StringReader r;
  string local_40;
  
  StringReader::StringReader(&r,s,size,0);
  parse(__return_storage_ptr__,&r,disable_extensions);
  skip_whitespace_and_comments(&r,disable_extensions);
  bVar1 = StringReader::eof(&r);
  if (bVar1) {
    StringReader::~StringReader(&r);
    return __return_storage_ptr__;
  }
  this = (parse_error *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"unparsed data remains after value",&local_71);
  parse_error::parse_error(this,&local_40);
  __cxa_throw(this,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

JSON JSON::parse(const char* s, size_t size, bool disable_extensions) {
  StringReader r(s, size);
  auto ret = JSON::parse(r, disable_extensions);
  skip_whitespace_and_comments(r, disable_extensions);
  if (!r.eof()) {
    throw parse_error("unparsed data remains after value");
  }
  return ret;
}